

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANAplanner.cpp
# Opt level: O1

void __thiscall
anaPlanner::anaPlanner(anaPlanner *this,DiscreteSpaceInformation *environment,bool bSearchForward)

{
  FILE *pFVar1;
  anaSearchStateSpace_t *pSearchStateSpace;
  
  (this->super_SBPLPlanner)._vptr_SBPLPlanner = (_func_int **)&PTR_replan_00158570;
  this->bforwardsearch = bSearchForward;
  (this->super_SBPLPlanner).environment_ = environment;
  this->bsearchuntilfirstsolution = false;
  this->finitial_eps = 100000.0;
  this->searchexpands = 0;
  this->MaxMemoryCounter = 0;
  pFVar1 = fopen("debug.txt","w");
  this->fDeb = (FILE *)pFVar1;
  pSearchStateSpace = (anaSearchStateSpace_t *)operator_new(0x58);
  (pSearchStateSpace->searchMDP).StateArray.
  super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pSearchStateSpace->searchMDP).StateArray.
  super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pSearchStateSpace->searchMDP).StateArray.
  super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->pSearchStateSpace_ = pSearchStateSpace;
  CreateSearchStateSpace(this,pSearchStateSpace);
  InitializeSearchStateSpace(this,this->pSearchStateSpace_);
  return;
}

Assistant:

anaPlanner::anaPlanner(DiscreteSpaceInformation* environment, bool bSearchForward)
{
    bforwardsearch = bSearchForward;

    environment_ = environment;

    bsearchuntilfirstsolution = false;
    finitial_eps = ana_DEFAULT_INITIAL_EPS;
    searchexpands = 0;
    MaxMemoryCounter = 0;

    fDeb = fopen("debug.txt", "w");

    pSearchStateSpace_ = new anaSearchStateSpace_t;

    //create the ana planner
    if (CreateSearchStateSpace(pSearchStateSpace_) != 1) {
        printf("ERROR: failed to create statespace\n");
        return;
    }

    //set the start and goal states
    if (InitializeSearchStateSpace(pSearchStateSpace_) != 1) {
        printf("ERROR: failed to create statespace\n");
        return;
    }
}